

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

void __thiscall pbrt::HaltonPixelIndexer::SetPixel(HaltonPixelIndexer *this,Point2i *p)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  long lVar5;
  uint uVar6;
  int i;
  long lVar7;
  
  this->pixelSampleForIndex = 0;
  uVar6 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y *
          (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  if ((int)uVar6 < 2) {
    return;
  }
  uVar2 = (p->super_Tuple2<pbrt::Point2,_int>).x;
  uVar3 = (p->super_Tuple2<pbrt::Point2,_int>).y;
  lVar5 = 0;
  lVar7 = 0;
  do {
    if (lVar7 == 0) {
      uVar4 = InverseRadicalInverse<2>
                        ((ulong)(uVar2 & 0x7f),
                         (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x);
      lVar5 = 0;
    }
    else {
      if (lVar7 == 2) {
        this->pixelSampleForIndex = lVar5 % (long)(ulong)uVar6;
        return;
      }
      uVar4 = InverseRadicalInverse<3>
                        ((ulong)(uVar3 & 0x7f),
                         (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.y);
      lVar5 = 4;
    }
    piVar1 = this->multInverse + lVar7;
    lVar7 = lVar7 + 1;
    lVar5 = (long)*piVar1 * uVar4 *
            (long)((int)uVar6 / *(int *)((long)this->multInverse + lVar5 + -0x10)) +
            this->pixelSampleForIndex;
    this->pixelSampleForIndex = lVar5;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    void SetPixel(const Point2i &p) {
        pixelSampleForIndex = 0;

        int sampleStride = baseScales[0] * baseScales[1];
        if (sampleStride > 1) {
            Point2i pm(Mod(p[0], MaxHaltonResolution), Mod(p[1], MaxHaltonResolution));
            for (int i = 0; i < 2; ++i) {
                uint64_t dimOffset =
                    (i == 0) ? InverseRadicalInverse<2>(pm[i], baseExponents[i])
                             : InverseRadicalInverse<3>(pm[i], baseExponents[i]);
                pixelSampleForIndex +=
                    dimOffset * (sampleStride / baseScales[i]) * multInverse[i];
            }
            pixelSampleForIndex %= sampleStride;
        }
    }